

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void al_color_rgb_to_yuv(float red,float green,float blue,float *y,float *u,float *v)

{
  *y = blue * 0.114 + red * 0.299 + green * 0.587;
  *u = blue * 0.436 + red * -0.14713 + green * -0.28886;
  *v = blue * -0.10001 + red * 0.615 + green * -0.51499;
  *u = (*u / 0.436 + 1.0) * 0.5;
  *v = (*v / 0.615 + 1.0) * 0.5;
  return;
}

Assistant:

void al_color_rgb_to_yuv(float red, float green, float blue,
   float *y, float *u, float *v)
{
   *y = red * 0.299 + green * 0.587 + blue * 0.114;
   *u = red * -0.14713 + green * -0.28886 + blue * 0.436;
   *v = red * 0.615 + green * -0.51499 + blue * -0.10001;
   /* Normalize chroma components into 0..1 range. */
   *u = (*u / 0.436 + 1) * 0.5;
   *v = (*v / 0.615 + 1) * 0.5;
}